

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall helics::CommonCore::getErrorMessage_abi_cxx11_(CommonCore *this)

{
  memory_order mVar1;
  undefined4 *puVar2;
  long in_RSI;
  string *in_RDI;
  memory_order __b;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  int iVar4;
  
  puVar2 = (undefined4 *)(in_RSI + 0x230);
  iVar4 = 5;
  mVar1 = CLI::std::operator&(seq_cst,__memory_order_mask);
  if (iVar4 - 1U < 2) {
    uVar3 = *puVar2;
  }
  else if (iVar4 == 5) {
    uVar3 = *puVar2;
  }
  else {
    uVar3 = *puVar2;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar4,mVar1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar3,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

std::string CommonCore::getErrorMessage() const
{
    // used to sync threads and ensure a string is available
    (void)lastErrorCode.load();
    return lastErrorString;
}